

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void create_context_buffer(j_compress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  void *__src;
  long in_RDI;
  JSAMPARRAY fake_buffer;
  JSAMPARRAY true_buffer;
  jpeg_component_info *compptr;
  int i;
  int ci;
  int rgroup_height;
  my_prep_ptr prep;
  undefined8 local_38;
  undefined8 local_28;
  undefined4 local_1c;
  undefined4 local_18;
  
  lVar2 = *(long *)(in_RDI + 0x1c0);
  iVar1 = *(int *)(in_RDI + 0x13c);
  local_38 = (*(code *)**(undefined8 **)(in_RDI + 8))
                       (in_RDI,1,(long)(*(int *)(in_RDI + 0x4c) * 5 * iVar1) << 3);
  local_18 = 0;
  local_28 = *(long *)(in_RDI + 0x58);
  for (; local_18 < *(int *)(in_RDI + 0x4c); local_18 = local_18 + 1) {
    __src = (void *)(**(code **)(*(long *)(in_RDI + 8) + 0x10))
                              (in_RDI,1,(long)((ulong)*(uint *)(local_28 + 0x1c) * 8 *
                                              (long)*(int *)(in_RDI + 0x138)) /
                                        (long)*(int *)(local_28 + 8) & 0xffffffff,iVar1 * 3);
    memcpy((void *)(local_38 + (long)iVar1 * 8),__src,(long)(iVar1 * 3) << 3);
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      *(undefined8 *)(local_38 + (long)local_1c * 8) =
           *(undefined8 *)((long)__src + (long)(iVar1 * 2 + local_1c) * 8);
      *(undefined8 *)(local_38 + (long)(iVar1 * 4 + local_1c) * 8) =
           *(undefined8 *)((long)__src + (long)local_1c * 8);
    }
    *(long *)(lVar2 + 0x10 + (long)local_18 * 8) = local_38 + (long)iVar1 * 8;
    local_38 = local_38 + (long)(iVar1 * 5) * 8;
    local_28 = local_28 + 0x60;
  }
  return;
}

Assistant:

LOCAL(void)
create_context_buffer(j_compress_ptr cinfo)
{
  my_prep_ptr prep = (my_prep_ptr)cinfo->prep;
  int rgroup_height = cinfo->max_v_samp_factor;
  int ci, i;
  jpeg_component_info *compptr;
  JSAMPARRAY true_buffer, fake_buffer;

  /* Grab enough space for fake row pointers for all the components;
   * we need five row groups' worth of pointers for each component.
   */
  fake_buffer = (JSAMPARRAY)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (cinfo->num_components * 5 * rgroup_height) *
                                sizeof(JSAMPROW));

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Allocate the actual buffer space (3 row groups) for this component.
     * We make the buffer wide enough to allow the downsampler to edge-expand
     * horizontally within the buffer, if it so chooses.
     */
    true_buffer = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       (JDIMENSION)(((long)compptr->width_in_blocks * DCTSIZE *
                     cinfo->max_h_samp_factor) / compptr->h_samp_factor),
       (JDIMENSION)(3 * rgroup_height));
    /* Copy true buffer row pointers into the middle of the fake row array */
    MEMCOPY(fake_buffer + rgroup_height, true_buffer,
            3 * rgroup_height * sizeof(JSAMPROW));
    /* Fill in the above and below wraparound pointers */
    for (i = 0; i < rgroup_height; i++) {
      fake_buffer[i] = true_buffer[2 * rgroup_height + i];
      fake_buffer[4 * rgroup_height + i] = true_buffer[i];
    }
    prep->color_buf[ci] = fake_buffer + rgroup_height;
    fake_buffer += 5 * rgroup_height; /* point to space for next component */
  }
}